

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O2

int bcf_hdr_combine(bcf_hdr_t *dst,bcf_hdr_t *src)

{
  char **ppcVar1;
  kh_vdict_t *h;
  kh_vdict_t *h_00;
  kh_cstr_t key;
  uint uVar2;
  int iVar3;
  uint uVar4;
  khint_t kVar5;
  khint_t kVar6;
  bcf_hrec_t *pbVar7;
  bcf_hrec_t *pbVar8;
  ulong uVar9;
  long lVar10;
  int local_5c;
  int local_4c;
  
  uVar2 = dst->nhrec;
  if (dst->nhrec < 1) {
    uVar2 = 0;
  }
  lVar10 = 0;
  local_4c = 0;
  local_5c = 0;
  do {
    if (src->nhrec <= lVar10) {
      if (local_5c != 0) {
        bcf_hdr_sync(dst);
      }
      return local_4c;
    }
    pbVar8 = src->hrec[lVar10];
    iVar3 = pbVar8->type;
    if (iVar3 == 4) {
      uVar4 = bcf_hrec_find_key(pbVar8,"ID");
      if ((-1 < (int)uVar4) &&
         (pbVar7 = bcf_hdr_get_hrec(dst,4,"ID",pbVar8->vals[uVar4],pbVar8->key),
         pbVar7 == (bcf_hrec_t *)0x0)) {
        pbVar8 = bcf_hrec_dup(pbVar8);
        iVar3 = bcf_hdr_add_hrec(dst,pbVar8);
        local_5c = local_5c + iVar3;
      }
    }
    else if ((iVar3 == 5) && (pbVar8->value != (char *)0x0)) {
      for (uVar9 = 0; uVar2 != uVar9; uVar9 = uVar9 + 1) {
        if ((dst->hrec[uVar9]->type == 5) &&
           (iVar3 = strcmp(pbVar8->key,dst->hrec[uVar9]->key), iVar3 == 0)) goto LAB_00116e79;
      }
      pbVar8 = bcf_hrec_dup(pbVar8);
      iVar3 = bcf_hdr_add_hrec(dst,pbVar8);
      local_5c = local_5c + iVar3;
    }
    else {
      uVar4 = bcf_hrec_find_key(pbVar8,"ID");
      if ((int)uVar4 < 0) {
        __assert_fail("j>=0",
                      "/workspace/llm4binary/github/license_c_cmakelists/gatoravi[P]bam-parser-tutorial/htslib/vcf.c"
                      ,0x8c4,"int bcf_hdr_combine(bcf_hdr_t *, const bcf_hdr_t *)");
      }
      ppcVar1 = pbVar8->vals;
      pbVar7 = bcf_hdr_get_hrec(dst,iVar3,"ID",ppcVar1[uVar4],(char *)0x0);
      if (pbVar7 == (bcf_hrec_t *)0x0) {
        pbVar8 = bcf_hrec_dup(pbVar8);
        iVar3 = bcf_hdr_add_hrec(dst,pbVar8);
        local_5c = local_5c + iVar3;
      }
      else if (iVar3 - 1U < 2) {
        h = (kh_vdict_t *)src->dict[0];
        h_00 = (kh_vdict_t *)dst->dict[0];
        key = *ppcVar1;
        kVar5 = kh_get_vdict(h,key);
        kVar6 = kh_get_vdict(h_00,key);
        uVar4 = h_00->vals[kVar6].info[pbVar7->type] ^ h->vals[kVar5].info[pbVar7->type];
        if ((uVar4 & 0xf00) != 0) {
          fprintf(_stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n"
                  ,key);
          uVar4 = h_00->vals[kVar6].info[pbVar7->type] ^ h->vals[kVar5].info[pbVar7->type];
          local_4c = 1;
        }
        if ((uVar4 & 0xf0) != 0) {
          fprintf(_stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n",
                  *src->hrec[lVar10]->vals);
          local_4c = 1;
        }
      }
    }
LAB_00116e79:
    lVar10 = lVar10 + 1;
  } while( true );
}

Assistant:

int bcf_hdr_combine(bcf_hdr_t *dst, const bcf_hdr_t *src)
{
    int i, ndst_ori = dst->nhrec, need_sync = 0, ret = 0;
    for (i=0; i<src->nhrec; i++)
    {
        if ( src->hrec[i]->type==BCF_HL_GEN && src->hrec[i]->value )
        {
            int j;
            for (j=0; j<ndst_ori; j++)
            {
                if ( dst->hrec[j]->type!=BCF_HL_GEN ) continue;

                // Checking only the key part of generic lines, otherwise
                // the VCFs are too verbose. Should we perhaps add a flag
                // to bcf_hdr_combine() and make this optional?
                if ( !strcmp(src->hrec[i]->key,dst->hrec[j]->key) ) break;
            }
            if ( j>=ndst_ori )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
        }
        else if ( src->hrec[i]->type==BCF_HL_STR )
        {
            // NB: we are ignoring fields without ID
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            if ( j>=0 )
            {
                bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], src->hrec[i]->key);
                if ( !rec )
                    need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            }
        }
        else
        {
            int j = bcf_hrec_find_key(src->hrec[i],"ID");
            assert( j>=0 ); // this should always be true for valid VCFs

            bcf_hrec_t *rec = bcf_hdr_get_hrec(dst, src->hrec[i]->type, "ID", src->hrec[i]->vals[j], NULL);
            if ( !rec )
                need_sync += bcf_hdr_add_hrec(dst, bcf_hrec_dup(src->hrec[i]));
            else if ( src->hrec[i]->type==BCF_HL_INFO || src->hrec[i]->type==BCF_HL_FMT )
            {
                // Check that both records are of the same type. The bcf_hdr_id2length
                // macro cannot be used here because dst header is not synced yet.
                vdict_t *d_src = (vdict_t*)src->dict[BCF_DT_ID];
                vdict_t *d_dst = (vdict_t*)dst->dict[BCF_DT_ID];
                khint_t k_src  = kh_get(vdict, d_src, src->hrec[i]->vals[0]);
                khint_t k_dst  = kh_get(vdict, d_dst, src->hrec[i]->vals[0]);
                if ( (kh_val(d_src,k_src).info[rec->type]>>8 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>8 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different lengths\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
                if ( (kh_val(d_src,k_src).info[rec->type]>>4 & 0xf) != (kh_val(d_dst,k_dst).info[rec->type]>>4 & 0xf) )
                {
                    fprintf(stderr,"Warning: trying to combine \"%s\" tag definitions of different types\n", src->hrec[i]->vals[0]);
                    ret |= 1;
                }
            }
        }
    }
    if ( need_sync ) bcf_hdr_sync(dst);
    return ret;
}